

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

vector<char_data_*,_std::allocator<char_data_*>_> * __thiscall
CQueue::GetCharacterData<char_data*&>
          (vector<char_data_*,_std::allocator<char_data_*>_> *__return_storage_ptr__,CQueue *this,
          tuple<char_data_*&> *t)

{
  pointer *pppcVar1;
  char_data **__args;
  pointer ppcVar2;
  anon_class_8_1_18cdd2e6 processTuple;
  
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (t->super__Tuple_impl<0UL,_char_data_*&>).super__Head_base<0UL,_char_data_*&,_false>.
           _M_head_impl;
  ppcVar2 = (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar2 == (pointer)0x0) {
    std::vector<char_data*,std::allocator<char_data*>>::_M_realloc_insert<char_data*const&>
              ((vector<char_data*,std::allocator<char_data*>> *)__return_storage_ptr__,(iterator)0x0
               ,__args);
  }
  else {
    *ppcVar2 = *__args;
    pppcVar1 = &(__return_storage_ptr__->
                super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CHAR_DATA*> GetCharacterData(std::tuple<Tp...>& t)
	{
		std::vector<CHAR_DATA*> accumulator;

		std::apply([&] (const auto&... tupleArgs) 
		{
			auto processTuple = [&](const auto& x)
			{
				// decay x to get the actual argument type to compare to our character data type 
		 		if constexpr (std::is_same<typename std::decay<decltype(x)>::type,CHAR_DATA*>::value)
					accumulator.push_back(x);
			};
			(processTuple(tupleArgs), ...);  // fold expression - calls processTuple for each argument in tupleArgs
		}, t);

		return accumulator;
	}